

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subcommand.c
# Opt level: O1

REF_STATUS remove_initial_field_adjoint(REF_NODE ref_node,REF_INT *ldim,REF_DBL **initial_field)

{
  int iVar1;
  int iVar2;
  REF_GLOB *pRVar3;
  REF_STATUS RVar4;
  REF_DBL *pRVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  iVar1 = *ldim;
  if (((long)iVar1 & 1U) == 0) {
    uVar6 = iVar1 >> 1;
    *ldim = uVar6;
    iVar2 = ref_node->max;
    if (0 < (long)iVar2) {
      pRVar3 = ref_node->global;
      lVar8 = 0;
      lVar9 = 0;
      lVar10 = 0;
      do {
        if ((lVar10 != 0 && 0 < (int)uVar6) && -1 < pRVar3[lVar10]) {
          pRVar5 = *initial_field;
          uVar7 = 0;
          do {
            *(undefined8 *)((long)pRVar5 + uVar7 * 8 + lVar9) =
                 *(undefined8 *)((long)pRVar5 + uVar7 * 8 + lVar8);
            uVar7 = uVar7 + 1;
          } while (uVar6 != uVar7);
        }
        lVar10 = lVar10 + 1;
        lVar9 = lVar9 + (long)(int)uVar6 * 8;
        lVar8 = lVar8 + (long)iVar1 * 8;
      } while (lVar10 != iVar2);
    }
    fflush(_stdout);
    uVar6 = ref_node->max * *ldim;
    if (0 < (int)uVar6) {
      pRVar5 = (REF_DBL *)realloc(*initial_field,(ulong)uVar6 << 3);
      *initial_field = pRVar5;
    }
    RVar4 = 0;
    if (*initial_field == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             0xba2,"remove_initial_field_adjoint","realloc *initial_field NULL");
      uVar7 = (long)ref_node->max * (long)*ldim;
      printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",uVar7 & 0xffffffff,uVar7,8,
             uVar7 * 8);
      RVar4 = 2;
    }
  }
  else {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           0xb98,"remove_initial_field_adjoint","volume field should have a even leading dimension")
    ;
    RVar4 = 1;
  }
  return RVar4;
}

Assistant:

static REF_STATUS remove_initial_field_adjoint(REF_NODE ref_node, REF_INT *ldim,
                                               REF_DBL **initial_field) {
  REF_INT i, node;
  RAS((*ldim) % 2 == 0, "volume field should have a even leading dimension");
  (*ldim) /= 2;
  each_ref_node_valid_node(ref_node, node) {
    if (0 != node) {
      for (i = 0; i < (*ldim); i++) {
        (*initial_field)[i + (*ldim) * node] =
            (*initial_field)[i + 2 * (*ldim) * node];
      }
    }
  }
  ref_realloc(*initial_field, (*ldim) * ref_node_max(ref_node), REF_DBL);
  return REF_SUCCESS;
}